

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

Pointer<anurbs::BrepEdge> __thiscall
anurbs::Ref<anurbs::BrepEdge>::data(Ref<anurbs::BrepEdge> *this)

{
  __shared_ptr_access<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  shared_ptr<anurbs::BrepEdge> sVar1;
  Pointer<anurbs::BrepEdge> PVar2;
  Ref<anurbs::BrepEdge> *this_local;
  
  std::
  __shared_ptr_access<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(in_RSI);
  sVar1 = Entry<anurbs::BrepEdge>::data((Entry<anurbs::BrepEdge> *)this);
  PVar2.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  PVar2.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Pointer<anurbs::BrepEdge>)
         PVar2.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<TData> data() const
    {
        return m_entry->data();
    }